

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O0

void main_sheet_get_sheetfile_callback
               (unzFile *zip,XML_Char *filename,XML_Char *contenttype,void *callbackdata)

{
  void *pvVar1;
  XML_Char *filename_00;
  size_t local_40;
  size_t i;
  XML_Char *relfilename;
  main_sheet_get_rels_callback_data *data;
  void *callbackdata_local;
  XML_Char *contenttype_local;
  XML_Char *filename_local;
  unzFile *zip_local;
  
  if (*(long *)((long)callbackdata + 0x18) == 0) {
    expat_process_zip_file
              (zip,filename,main_sheet_get_relid_expat_callback_element_start,
               (XML_EndElementHandler)0x0,(XML_CharacterDataHandler)0x0,callbackdata,
               (XML_Parser *)callbackdata);
  }
  if (*(long *)((long)callbackdata + 0x18) != 0) {
    for (local_40 = strlen(filename); (local_40 != 0 && (filename[local_40 - 1] != '/'));
        local_40 = local_40 - 1) {
    }
    if (*(long *)((long)callbackdata + 0x10) != 0) {
      free(*(void **)((long)callbackdata + 0x10));
    }
    pvVar1 = malloc(local_40 + 1);
    *(void **)((long)callbackdata + 0x10) = pvVar1;
    if (pvVar1 != (void *)0x0) {
      memcpy(*(void **)((long)callbackdata + 0x10),filename,local_40);
      *(undefined1 *)(*(long *)((long)callbackdata + 0x10) + local_40) = 0;
    }
    filename_00 = get_relationship_filename(filename);
    if (filename_00 == (XML_Char *)0x0) {
      free(*(void **)((long)callbackdata + 0x18));
      *(undefined8 *)((long)callbackdata + 0x18) = 0;
      if (*(long *)((long)callbackdata + 0x10) != 0) {
        free(*(void **)((long)callbackdata + 0x10));
        *(undefined8 *)((long)callbackdata + 0x10) = 0;
      }
    }
    else {
      expat_process_zip_file
                (zip,filename_00,main_sheet_get_sheetfile_expat_callback_element_start,
                 (XML_EndElementHandler)0x0,(XML_CharacterDataHandler)0x0,callbackdata,
                 (XML_Parser *)callbackdata);
      free(filename_00);
    }
  }
  return;
}

Assistant:

void main_sheet_get_sheetfile_callback (ZIPFILETYPE* zip, const XML_Char* filename, const XML_Char* contenttype, void* callbackdata)
{
  struct main_sheet_get_rels_callback_data* data = (struct main_sheet_get_rels_callback_data*)callbackdata;
  if (!data->sheetrelid) {
    expat_process_zip_file(zip, filename, main_sheet_get_relid_expat_callback_element_start, NULL, NULL, callbackdata, &data->xmlparser);
  }
  if (data->sheetrelid) {
    XML_Char* relfilename;
    //determine base name (including trailing slash)
    size_t i = XML_Char_len(filename);
    while (i > 0) {
      if (filename[i - 1] == '/')
        break;
      i--;
    }
    if (data->basepath)
      free(data->basepath);
    if ((data->basepath = XML_Char_malloc(i + 1)) != NULL) {
      XML_Char_poscpy(data->basepath, 0, filename, i);
      data->basepath[i] = 0;
    }
    //find sheet filename in relationship contents
    if ((relfilename = get_relationship_filename(filename)) != NULL) {
      expat_process_zip_file(zip, relfilename, main_sheet_get_sheetfile_expat_callback_element_start, NULL, NULL, callbackdata, &data->xmlparser);
      free(relfilename);
    } else {
      free(data->sheetrelid);
      data->sheetrelid = NULL;
      if (data->basepath) {
        free(data->basepath);
        data->basepath = NULL;
      }
    }
  }
}